

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall Lib::DArray<unsigned_int_**>::DArray(DArray<unsigned_int_**> *this,size_t size)

{
  void *placement;
  uint ***pppuVar1;
  
  this->_size = size;
  this->_capacity = size;
  if (size == 0) {
    pppuVar1 = (uint ***)0x0;
  }
  else {
    placement = Lib::alloc(size << 3);
    pppuVar1 = array_new<unsigned_int**>(placement,this->_capacity);
  }
  this->_array = pppuVar1;
  return;
}

Assistant:

inline
  DArray (size_t size=0)
    : _size(size), _capacity(size)
  {
    if(size>0) {
      void* mem = ALLOC_KNOWN(sizeof(C)*_capacity,"DArray<>");
      _array = array_new<C>(mem, _capacity);
    } else {
      _array=0;
    }
  }